

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementHexaANCF_3813::GetStateBlock(ChElementHexaANCF_3813 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  GetStateBlock((ChElementHexaANCF_3813 *)&this[-1].field_0x4a78,in_RSI);
  return;
}

Assistant:

void ChElementHexaANCF_3813::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(6, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(9, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(12, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(15, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(18, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(21, 3) = m_nodes[7]->GetPos().eigen();
}